

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_aes_encrypt.c
# Opt level: O2

int tc_aes128_set_encrypt_key(TCAesKeySched_t s,uint8_t *k)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  
  iVar1 = 0;
  if (k != (uint8_t *)0x0 && s != (TCAesKeySched_t)0x0) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      uVar4 = *(uint *)(k + lVar2 * 4);
      s->words[lVar2] =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    }
    iVar1 = 1;
    for (uVar3 = 4; uVar3 != 0x2c; uVar3 = uVar3 + 1) {
      uVar4 = s->words[uVar3 - 1];
      if ((uVar3 & 3) == 0) {
        uVar4 = ((uint)sbox[uVar4 >> 0x18] |
                (uint)sbox[uVar4 & 0xff] << 8 |
                (uint)sbox[(uVar4 << 8) >> 0x10 & 0xff] << 0x10 |
                (uint)sbox[(uVar4 << 8) >> 0x18] << 0x18) ^
                *(uint *)(&DAT_0011b680 + ((uint)uVar3 & 0xfffffffc));
      }
      s->words[uVar3] = uVar4 ^ s->words[uVar3 - 4];
    }
  }
  return iVar1;
}

Assistant:

int tc_aes128_set_encrypt_key(TCAesKeySched_t s, const uint8_t *k)
{
	const unsigned int rconst[11] = {
		0x00000000, 0x01000000, 0x02000000, 0x04000000, 0x08000000, 0x10000000,
		0x20000000, 0x40000000, 0x80000000, 0x1b000000, 0x36000000
	};
	unsigned int i;
	unsigned int t;

	if (s == (TCAesKeySched_t) 0) {
		return TC_CRYPTO_FAIL;
	} else if (k == (const uint8_t *) 0) {
		return TC_CRYPTO_FAIL;
	}

	for (i = 0; i < Nk; ++i) {
		s->words[i] = (k[Nb*i]<<24) | (k[Nb*i+1]<<16) |
			      (k[Nb*i+2]<<8) | (k[Nb*i+3]);
	}

	for (; i < (Nb * (Nr + 1)); ++i) {
		t = s->words[i-1];
		if ((i % Nk) == 0) {
			t = subword(rotword(t)) ^ rconst[i/Nk];
		}
		s->words[i] = s->words[i-Nk] ^ t;
	}

	return TC_CRYPTO_SUCCESS;
}